

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv.c
# Opt level: O1

void ConvertRGB24ToY_C(uint8_t *rgb,uint8_t *y,int width)

{
  ulong uVar1;
  
  if (0 < width) {
    uVar1 = 0;
    do {
      y[uVar1] = (uint8_t)((uint)rgb[2] * 0x1914 + (uint)rgb[1] * 0x8123 + (uint)*rgb * 0x41c7 +
                           0x108000 >> 0x10);
      uVar1 = uVar1 + 1;
      rgb = rgb + 3;
    } while ((uint)width != uVar1);
  }
  return;
}

Assistant:

static void ConvertRGB24ToY_C(const uint8_t* WEBP_RESTRICT rgb,
                              uint8_t* WEBP_RESTRICT y, int width) {
  int i;
  for (i = 0; i < width; ++i, rgb += 3) {
    y[i] = VP8RGBToY(rgb[0], rgb[1], rgb[2], YUV_HALF);
  }
}